

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

Value * __thiscall minja::Value::operator-(Value *__return_storage_ptr__,Value *this)

{
  long lVar1;
  double local_10;
  
  if ((byte)((this->primitive_).m_data.m_type - number_integer) < 2) {
    lVar1 = get<long>(this);
    local_10 = (double)-lVar1;
    Value(__return_storage_ptr__,(int64_t *)&local_10);
  }
  else {
    local_10 = get<double>(this);
    local_10 = -local_10;
    Value(__return_storage_ptr__,&local_10);
  }
  return __return_storage_ptr__;
}

Assistant:

Value operator-() const {
      if (is_number_integer())
        return -get<int64_t>();
      else
        return -get<double>();
  }